

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QModelIndexList * __thiscall
QTreeView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QTreeView *this)

{
  char cVar1;
  QItemSelectionModel *pQVar2;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QModelIndex *)0x0;
  local_58.size = 0;
  pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if (pQVar2 != (QItemSelectionModel *)0x0) {
    QAbstractItemView::selectionModel((QAbstractItemView *)this);
    QItemSelectionModel::selectedIndexes();
    QArrayDataPointer<QModelIndex>::operator=(&local_58,(QArrayDataPointer<QModelIndex> *)&local_78)
    ;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_78);
  }
  uVar3 = 0;
  do {
    if ((ulong)local_58.size <= uVar3) {
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    local_78 = *(Data **)(local_58.ptr + uVar3);
    uStack_70 = (QModelIndex *)local_58.ptr[uVar3].i;
    local_68.ptr = local_58.ptr[uVar3].m.ptr;
    while( true ) {
      if ((((int)local_78 < 0) || ((long)local_78 < 0)) ||
         (local_68.ptr == (QAbstractItemModel *)0x0)) goto LAB_00546a7b;
      cVar1 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2c0))
                        (this,(QModelIndex *)&local_78);
      if (cVar1 != '\0') break;
      QModelIndex::parent(&local_90,(QModelIndex *)&local_78);
      local_68.ptr = local_90.m.ptr;
      local_78 = (Data *)CONCAT44(local_90.c,local_90.r);
      uStack_70 = (QModelIndex *)CONCAT44(local_90.i._4_4_,(undefined4)local_90.i);
    }
LAB_00546a7b:
    if ((((int)local_78 < 0) || (local_78._4_4_ < 0)) || (local_68.ptr == (QAbstractItemModel *)0x0)
       ) {
      QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                (__return_storage_ptr__,local_58.ptr + uVar3);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

QModelIndexList QTreeView::selectedIndexes() const
{
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (selectionModel())
        modelSelected = selectionModel()->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        // check that neither the parents nor the index is hidden before we add
        QModelIndex index = modelSelected.at(i);
        while (index.isValid() && !isIndexHidden(index))
            index = index.parent();
        if (index.isValid())
            continue;
        viewSelected.append(modelSelected.at(i));
    }
    return viewSelected;
}